

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

config_value * parser_parse_value(parser *parser,char *value)

{
  bool bVar1;
  parser_token pVar2;
  natwm_error nVar3;
  size_t sVar4;
  config_value *pcVar5;
  config_value *pcVar6;
  long *plVar7;
  char *pcVar8;
  size_t sVar9;
  undefined8 in_R9;
  size_t j;
  char *pcVar10;
  size_t sVar11;
  undefined8 uVar12;
  size_t local_68;
  size_t array_string_length;
  char *array_string;
  char *local_50;
  size_t local_48;
  size_t raw_string_length;
  char *local_38;
  char *array_value_items_string;
  
  uVar12 = 0x10699e;
  pVar2 = char_to_token(*value);
  switch(pVar2) {
  case ALPHA_CHAR:
    local_38 = (char *)((ulong)local_38 & 0xffffffffffffff00);
    nVar3 = string_to_boolean(value,(_Bool *)&local_38);
    if (nVar3 != NO_ERROR) {
      sVar9 = parser->line_num;
      pcVar8 = "Invalid boolean value \'%s\' found - Line %zu";
      goto LAB_00106c7c;
    }
    pcVar5 = config_value_create_boolean(local_38._0_1_);
    break;
  case ARRAY_START:
    sVar4 = strlen(value);
    pVar2 = char_to_token(value[sVar4 - 1]);
    if (pVar2 == ARRAY_END) {
      pcVar8 = string_init(value);
    }
    else {
      local_38 = (char *)0x0;
      local_48 = 0;
      nVar3 = array_context_get_delimiter(parser->buffer + parser->pos,']',&local_38,&local_48,true)
      ;
      pcVar8 = local_38;
      if (nVar3 != NO_ERROR) {
LAB_00106c2d:
        internal_logger(natwm_logger,LEVEL_ERROR,
                        "Could not find \']\' in array value string - Line %zu",parser->line_num);
        return (config_value *)0x0;
      }
      array_string_length = 0;
      local_68 = 0;
      nVar3 = string_strip_surrounding_spaces(local_38,(char **)&array_string_length,&local_68);
      free(pcVar8);
      pcVar8 = (char *)array_string_length;
      if (nVar3 != NO_ERROR) goto LAB_00106c2d;
      parser_move(parser,local_48 - 1);
    }
    local_38 = (char *)0x0;
    local_48 = 0;
    sVar4 = strlen(pcVar8);
    nVar3 = string_splice(pcVar8,1,sVar4 - 1,&local_38,&local_48);
    free(pcVar8);
    pcVar10 = local_38;
    if (nVar3 != NO_ERROR) {
      return (config_value *)0x0;
    }
    array_string = (char *)parser;
    raw_string_length = (size_t)list_create();
    if ((list *)raw_string_length != (list *)0x0) {
      local_50 = pcVar10;
      while( true ) {
        local_38 = (char *)0x0;
        local_48 = 0;
        nVar3 = array_context_get_delimiter(pcVar10,',',&local_38,&local_48,false);
        if (nVar3 != NO_ERROR) break;
        list_insert((list *)raw_string_length,local_38);
        pcVar10 = pcVar10 + local_48 + 1;
      }
      plVar7 = (long *)raw_string_length;
      if ((nVar3 == NOT_FOUND_ERROR) &&
         (pcVar8 = string_init(pcVar10), plVar7 = (long *)raw_string_length, pcVar8 != (char *)0x0))
      {
        list_insert((list *)raw_string_length,pcVar8);
        sVar9 = *(size_t *)((long)plVar7 + 0x10);
        pcVar8 = (char *)malloc(sVar9 * 8);
        if (pcVar8 == (char *)0x0) goto LAB_00106d03;
        pcVar10 = pcVar8 + sVar9 * 8;
        plVar7 = (long *)raw_string_length;
        while( true ) {
          pcVar10 = pcVar10 + -8;
          plVar7 = (long *)*plVar7;
          if (plVar7 == (long *)0x0) break;
          *(long *)pcVar10 = plVar7[2];
        }
        bVar1 = true;
      }
      else {
LAB_00106d03:
        while (plVar7 = (long *)*plVar7, plVar7 != (long *)0x0) {
          free((void *)plVar7[2]);
        }
        pcVar8 = (char *)0x0;
        sVar9 = 0;
        bVar1 = false;
      }
      list_destroy((list *)raw_string_length);
      pcVar10 = local_50;
      if (bVar1) {
        for (sVar11 = 0; sVar9 != sVar11; sVar11 = sVar11 + 1) {
          local_38 = (char *)0x0;
          nVar3 = string_strip_surrounding_spaces
                            (*(char **)(pcVar8 + sVar11 * 8),&local_38,(size_t *)0x0);
          if (nVar3 != NO_ERROR) {
            if ((nVar3 != NOT_FOUND_ERROR) || (sVar9 - 1 != sVar11)) {
              pcVar5 = (config_value *)0x0;
              internal_logger(natwm_logger,LEVEL_ERROR,
                              "Failed to parse array value item \'%s\' - Line %zu",
                              *(undefined8 *)(pcVar8 + sVar11 * 8),
                              *(undefined8 *)(array_string + 0x18));
              goto LAB_00106e5a;
            }
            free(*(void **)(pcVar8 + sVar11 * 8));
            sVar9 = sVar11;
            break;
          }
          free(*(void **)(pcVar8 + sVar11 * 8));
          *(char **)(pcVar8 + sVar11 * 8) = local_38;
        }
        pcVar5 = config_value_create_array(sVar9);
        if (pcVar5 != (config_value *)0x0) {
          for (sVar11 = 0; sVar9 != sVar11; sVar11 = sVar11 + 1) {
            pcVar6 = parser_parse_value((parser *)array_string,*(char **)(pcVar8 + sVar11 * 8));
            if (pcVar6 == (config_value *)0x0) goto LAB_00106e34;
            ((pcVar5->data).array)->values[sVar11] = pcVar6;
          }
          free(value);
LAB_00106e5a:
          free(local_50);
          value = pcVar8;
          goto LAB_00106b5f;
        }
        goto LAB_00106e41;
      }
    }
    value = pcVar10;
    pcVar5 = (config_value *)0x0;
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to parse array value items string - Line %zu",
                    *(undefined8 *)(array_string + 0x18));
    goto LAB_00106b5f;
  default:
    return (config_value *)0x0;
  case NUMERIC_CHAR:
    local_38 = (char *)0x0;
    nVar3 = string_to_number(value,(intmax_t *)&local_38);
    if (nVar3 != NO_ERROR) {
      sVar9 = parser->line_num;
      pcVar8 = "Invalid numeric value \'%s\' found - Line %zu";
      goto LAB_00106c7c;
    }
    pcVar5 = config_value_create_number((intmax_t)local_38);
    break;
  case QUOTE:
    sVar4 = strlen(value);
    local_38 = (char *)0x0;
    nVar3 = string_splice(value,1,sVar4 - 1,&local_38,(size_t *)0x0);
    if (nVar3 != NO_ERROR) {
      sVar9 = parser->line_num;
      pcVar8 = "Invalid string \'%s\' found - Line %zu";
      goto LAB_00106c7c;
    }
    pcVar5 = config_value_create_string(local_38);
    pcVar8 = local_38;
    if (pcVar5 == (config_value *)0x0) goto LAB_00106b23;
    goto LAB_00106b5f;
  case VARIABLE_START:
    pcVar5 = parser_find_variable(parser,value + 1);
    if (pcVar5 == (config_value *)0x0) {
      pcVar8 = "\'%s\' is not defined - Line: %zu";
    }
    else {
      pcVar5 = config_value_duplicate(pcVar5);
      if (pcVar5 != (config_value *)0x0) goto LAB_00106b5f;
      pcVar8 = "Failed to resolve variable \'%s\' - Line: %zu";
    }
    sVar9 = parser->line_num;
    value = value + 1;
LAB_00106c7c:
    internal_logger(natwm_logger,LEVEL_ERROR,pcVar8,value,sVar9,in_R9,uVar12);
    return (config_value *)0x0;
  }
  if (pcVar5 == (config_value *)0x0) {
    return (config_value *)0x0;
  }
LAB_00106b5f:
  free(value);
  return pcVar5;
LAB_00106e34:
  for (; sVar9 != sVar11; sVar11 = sVar11 + 1) {
    free(*(void **)(pcVar8 + sVar11 * 8));
  }
  config_value_destroy(pcVar5);
LAB_00106e41:
  free(local_50);
LAB_00106b23:
  free(pcVar8);
  return (config_value *)0x0;
}

Assistant:

struct config_value *parser_parse_value(struct parser *parser, char *value)
{
        switch (char_to_token(value[0])) {
        case ALPHA_CHAR:
                return parser_parse_boolean(parser, value);
        case ARRAY_START:
                return parser_parse_array(parser, value);
        case NUMERIC_CHAR:
                return parser_parse_number(parser, value);
        case QUOTE:
                return parser_parse_string(parser, value);
        case VARIABLE_START:
                return parser_parse_variable(parser, value);
        default:
                return NULL;
        }
}